

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::RealisticCamera::GenerateRay
          (RealisticCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  Vector3f d;
  Point3<float> p;
  Point3f o;
  undefined1 auVar2 [16];
  Vector3<float> v;
  undefined1 auVar3 [16];
  Point2f pFilm_00;
  bool bVar4;
  ExitPupilSample *pEVar5;
  long in_RSI;
  optional<pbrt::CameraRay> *in_RDI;
  Tuple2<pbrt::Point2,_float> uLens;
  float fVar6;
  Float FVar7;
  Float FVar8;
  undefined8 uVar10;
  undefined1 auVar9 [64];
  Vector3<float> VVar11;
  float in_stack_00000008;
  float in_stack_0000000c;
  Float cosTheta;
  Float weight;
  Ray ray;
  Ray rFilm;
  optional<pbrt::ExitPupilSample> eps;
  Point3f pFilm;
  Point2f pFilm2;
  Point2f s;
  float in_stack_fffffffffffffd08;
  Float in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd14;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd50;
  undefined4 uStack_2ac;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_ffffffffffffff24;
  RealisticCamera *this_00;
  optional local_60 [20];
  RealisticCamera *local_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  Tuple2<pbrt::Point2,_int> local_30;
  Tuple2<pbrt::Point2,_int> local_28;
  undefined8 local_20;
  undefined1 extraout_var [56];
  
  uLens = (Tuple2<pbrt::Point2,_float>)(in_RSI + 0x340);
  local_28 = (Tuple2<pbrt::Point2,_int>)
             Film::FullResolution
                       ((Film *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  fVar6 = in_stack_00000008 / (float)local_28.x;
  local_30 = (Tuple2<pbrt::Point2,_int>)
             Film::FullResolution
                       ((Film *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
  local_40 = local_20;
  auVar9._0_8_ = Bounds2<float>::Lerp
                           ((Bounds2<float> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            in_stack_fffffffffffffd18);
  auVar9._8_56_ = extraout_var;
  local_38 = vmovlpd_avx(auVar9._0_16_);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08,0.0);
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08);
  pFilm_00.super_Tuple2<pbrt::Point2,_float>.y = fVar6;
  pFilm_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_0000000c;
  SampleExitPupil((RealisticCamera *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffd98),pFilm_00,
                  (Point2f)uLens);
  bVar4 = pstd::optional::operator_cast_to_bool(local_60);
  if (bVar4) {
    pstd::optional<pbrt::ExitPupilSample>::operator->((optional<pbrt::ExitPupilSample> *)0x8aa0d1);
    uVar10 = 0;
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd38;
    p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffd30;
    p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
    this_00 = local_4c;
    VVar11 = Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffffd18,p);
    auVar3._8_8_ = uVar10;
    auVar3._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar3);
    Medium::TaggedPointer
              ((Medium *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (nullptr_t)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    o.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd50;
    o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffd48;
    o.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffd30;
    d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
    d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffd2c;
    Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),o,d,
             in_stack_fffffffffffffd0c,(Medium *)0x8aa206);
    Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    FVar7 = TraceLensesFromFilm(this_00,(Ray *)CONCAT44(in_stack_ffffffffffffff24,local_44),
                                (Ray *)local_4c);
    if ((FVar7 != 0.0) || (NAN(FVar7))) {
      FVar8 = CameraBase::SampleTime
                        ((CameraBase *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                         ,in_stack_fffffffffffffd0c);
      Medium::operator=((Medium *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (Medium *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      CameraBase::RenderFromCamera
                ((CameraBase *)in_stack_fffffffffffffd18,
                 (Ray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      Ray::operator=((Ray *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (Ray *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      uVar10 = 0;
      VVar11.super_Tuple3<pbrt::Vector3,_float>.y = FVar8;
      VVar11.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd58;
      VVar11.super_Tuple3<pbrt::Vector3,_float>.z = FVar7;
      VVar11 = Normalize<float>(VVar11);
      uStack_2ac = (undefined4)((ulong)uVar10 >> 0x20);
      auVar2._8_4_ = (int)uVar10;
      auVar2._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar2._12_4_ = uStack_2ac;
      vmovlpd_avx(auVar2);
      uVar10 = 0;
      v.super_Tuple3<pbrt::Vector3,_float>.y = FVar8;
      v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd58;
      v.super_Tuple3<pbrt::Vector3,_float>.z = FVar7;
      VVar11 = Normalize<float>(v);
      auVar1._8_8_ = uVar10;
      auVar1._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar1);
      Pow<4>(in_stack_fffffffffffffd14);
      pEVar5 = pstd::optional<pbrt::ExitPupilSample>::operator->
                         ((optional<pbrt::ExitPupilSample> *)0x8aa4a3);
      FVar7 = pEVar5->pdf;
      FVar8 = LensRearZ((RealisticCamera *)0x8aa4c7);
      fVar6 = Sqr<float>(FVar8);
      Ray::Ray((Ray *)CONCAT44(FVar8,FVar7),(Ray *)CONCAT44(fVar6,in_stack_fffffffffffffd08));
      SampledSpectrum::SampledSpectrum((SampledSpectrum *)CONCAT44(FVar8,FVar7),fVar6);
      pstd::optional<pbrt::CameraRay>::optional
                ((optional<pbrt::CameraRay> *)CONCAT44(FVar8,FVar7),
                 (CameraRay *)CONCAT44(fVar6,in_stack_fffffffffffffd08));
    }
    else {
      memset(in_RDI,0,0x40);
      pstd::optional<pbrt::CameraRay>::optional(in_RDI);
    }
  }
  else {
    memset(in_RDI,0,0x40);
    pstd::optional<pbrt::CameraRay>::optional(in_RDI);
  }
  pstd::optional<pbrt::ExitPupilSample>::~optional((optional<pbrt::ExitPupilSample> *)0x8aa570);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRay> RealisticCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Find point on film, _pFilm_, corresponding to _sample.pFilm_
    Point2f s(sample.pFilm.x / film.FullResolution().x,
              sample.pFilm.y / film.FullResolution().y);
    Point2f pFilm2 = physicalExtent.Lerp(s);
    Point3f pFilm(-pFilm2.x, pFilm2.y, 0);

    // Trace ray from _pFilm_ through lens system
    pstd::optional<ExitPupilSample> eps =
        SampleExitPupil(Point2f(pFilm.x, pFilm.y), sample.pLens);
    if (!eps)
        return {};
    Ray rFilm(pFilm, eps->pPupil - pFilm);
    Ray ray;
    Float weight = TraceLensesFromFilm(rFilm, &ray);
    if (weight == 0)
        return {};

    // Finish initialization of _RealisticCamera_ ray
    ray.time = SampleTime(sample.time);
    ray.medium = medium;
    ray = RenderFromCamera(ray);
    ray.d = Normalize(ray.d);

    // Compute weighting for _RealisticCamera_ ray
    Float cosTheta = Normalize(rFilm.d).z;
    weight *= Pow<4>(cosTheta) / (eps->pdf * Sqr(LensRearZ()));

    return CameraRay{ray, SampledSpectrum(weight)};
}